

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void send_good_message(int id_destination,int id_taken_message)

{
  int __fd;
  undefined4 *__buf;
  mapped_type *__addr;
  int local_1c;
  
  local_1c = id_destination;
  __buf = (undefined4 *)malloc(0x10);
  *__buf = 0;
  __buf[1] = (uint)id_taken_message >> 0x18 | (id_taken_message & 0xff0000U) >> 8 |
             (id_taken_message & 0xff00U) << 8 | id_taken_message << 0x18;
  __fd = socket_fd;
  __addr = std::
           map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
           ::operator[](&connections,&local_1c);
  sendto(__fd,__buf,8,0,(sockaddr *)__addr,0x10);
  free(__buf);
  return;
}

Assistant:

void send_good_message(int id_destination, int id_taken_message) {
    void* cur_buf = malloc(16);
    ((int*)cur_buf)[0] = htonl((uint32_t)GOODMSG);
    ((int*)cur_buf)[1] = htonl((uint32_t)id_taken_message);
    sendto(socket_fd, cur_buf, 2 * sizeof(int), 0,
           (struct sockaddr *)&connections[id_destination], sizeof(struct sockaddr_in));
    free(cur_buf);
}